

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall Fn_CallMultipleArgs_Test::~Fn_CallMultipleArgs_Test(Fn_CallMultipleArgs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Fn, CallMultipleArgs) {
	MockParser mock(
		"let a = fn(a, b, c) {\n"
		"  let d = a\n"
		"}\n"
		"let b = a(3, 4, 5)"
	);

	INS2(BC_SET_F, 0, 1);
	INS2(BC_SET_N, 1, 0);
	INS2(BC_SET_N, 2, 1);
	INS2(BC_SET_N, 3, 2);
	INS(BC_CALL, 0, 1, 3);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_MOV, 3, 0);
	INS(BC_RET, 0, 0, 0);
}